

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_external_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  ulong uVar5;
  cram_block *pcVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    iVar1 = slice->hdr->num_blocks;
    iVar4 = -1;
    if (0 < (long)iVar1) {
      lVar9 = 0;
      do {
        pcVar6 = slice->block[lVar9];
        if (((pcVar6 != (cram_block *)0x0) && (pcVar6->content_type == EXTERNAL)) &&
           (pcVar6->content_id == (c->field_6).huffman.ncodes)) {
          if (iVar1 == (int)lVar9) {
            return -1;
          }
          goto LAB_00155399;
        }
        lVar9 = lVar9 + 1;
      } while (iVar1 != lVar9);
    }
  }
  else {
    pcVar6 = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (pcVar6 == (cram_block *)0x0) {
      iVar4 = -(uint)(*out_size != 0);
    }
    else {
LAB_00155399:
      puVar2 = pcVar6->data;
      iVar1 = pcVar6->idx;
      iVar3 = *out_size + iVar1;
      pcVar6->idx = iVar3;
      iVar4 = -1;
      if (puVar2 != (uchar *)0x0 && iVar3 <= pcVar6->uncomp_size) {
        __ptr = *(void **)(out_ + 0x20);
        uVar5 = *(ulong *)(out_ + 0x28);
        lVar9 = *(long *)(out_ + 0x30);
        sVar7 = (size_t)*out_size;
        if (uVar5 <= lVar9 + sVar7) {
          do {
            auVar10._8_4_ = (int)(uVar5 >> 0x20);
            auVar10._0_8_ = uVar5;
            auVar10._12_4_ = 0x45300000;
            dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 1.5;
            uVar8 = (ulong)dVar11;
            sVar7 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
            if (uVar5 == 0) {
              sVar7 = 0x400;
            }
            *(size_t *)(out_ + 0x28) = sVar7;
            __ptr = realloc(__ptr,sVar7);
            *(void **)(out_ + 0x20) = __ptr;
            uVar5 = *(ulong *)(out_ + 0x28);
            lVar9 = *(long *)(out_ + 0x30);
            sVar7 = (size_t)*out_size;
          } while (uVar5 <= lVar9 + sVar7);
        }
        memcpy((void *)((long)__ptr + lVar9),puVar2 + iVar1,sVar7);
        *(long *)(out_ + 0x30) = *(long *)(out_ + 0x30) + (long)*out_size;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int cram_external_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    BLOCK_APPEND(out, cp, *out_size);
    return 0;
}